

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
perfetto::protos::gen::DetachRequest::SerializeAsArray
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          DetachRequest *this)

{
  Message *msg_00;
  undefined1 local_d8 [8];
  HeapBuffered<protozero::Message> msg;
  DetachRequest *this_local;
  
  msg.msg_.root_arena_.blocks_.
  super__List_base<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>.
  _M_impl._M_node._M_size = (size_t)this;
  protozero::HeapBuffered<protozero::Message>::HeapBuffered
            ((HeapBuffered<protozero::Message> *)local_d8);
  msg_00 = protozero::HeapBuffered<protozero::Message>::get
                     ((HeapBuffered<protozero::Message> *)local_d8);
  Serialize(this,msg_00);
  protozero::HeapBuffered<protozero::Message>::SerializeAsArray
            (__return_storage_ptr__,(HeapBuffered<protozero::Message> *)local_d8);
  protozero::HeapBuffered<protozero::Message>::~HeapBuffered
            ((HeapBuffered<protozero::Message> *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> DetachRequest::SerializeAsArray() const {
  ::protozero::HeapBuffered<::protozero::Message> msg;
  Serialize(msg.get());
  return msg.SerializeAsArray();
}